

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O2

String * __thiscall String::operator+(String *__return_storage_ptr__,String *this,String *other)

{
  String *other_00;
  String local_40;
  
  String(&local_40,this);
  other_00 = append(&local_40,other);
  String(__return_storage_ptr__,other_00);
  ~String(&local_40);
  return __return_storage_ptr__;
}

Assistant:

String operator+(const String& other) const {return String(*this).append(other);}